

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bcatcstr(bstring b,char *s)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  int iVar7;
  
  if ((b != (bstring)0x0) && (puVar3 = b->data, puVar3 != (uchar *)0x0)) {
    uVar2 = b->slen;
    if ((-1 < (int)uVar2) &&
       ((iVar4 = b->mlen, (int)uVar2 <= iVar4 && (s != (char *)0x0 && 0 < iVar4)))) {
      iVar7 = iVar4 - uVar2;
      if (iVar7 == 0 || iVar4 < (int)uVar2) {
        iVar7 = 0;
      }
      else {
        lVar5 = 0;
        do {
          uVar1 = s[lVar5];
          puVar3[lVar5 + (ulong)uVar2] = uVar1;
          if (uVar1 == '\0') {
            b->slen = b->slen + (int)lVar5;
            return 0;
          }
          lVar5 = lVar5 + 1;
        } while (iVar7 != (int)lVar5);
        s = s + lVar5;
      }
      b->slen = b->slen + iVar7;
      sVar6 = strlen(s);
      iVar4 = bcatblk(b,s,(int)sVar6);
      return iVar4;
    }
  }
  return -1;
}

Assistant:

int bcatcstr (bstring b, const char * s) {
char * d;
int i, l;

	if (b == NULL || b->data == NULL || b->slen < 0 || b->mlen < b->slen
	 || b->mlen <= 0 || s == NULL) return BSTR_ERR;

	/* Optimistically concatenate directly */
	l = b->mlen - b->slen;
	d = (char *) &b->data[b->slen];
	for (i=0; i < l; i++) {
		if ((*d++ = *s++) == '\0') {
			b->slen += i;
			return BSTR_OK;
		}
	}
	b->slen += i;

	/* Need to explicitely resize and concatenate tail */
	return bcatblk (b, (const void *) s, (int) strlen (s));
}